

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

bool progressMonitor(void *ptr,double n)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  uVar1 = (long)embree::progressWidth - 2;
  auVar5._8_4_ = (int)(uVar1 >> 0x20);
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * n;
  uVar2 = (ulong)dVar6;
  uVar2 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  if (uVar1 < uVar2) {
    uVar2 = uVar1;
  }
  if (uVar2 < embree::progressDots) {
    uVar2 = embree::progressDots;
  }
  LOCK();
  UNLOCK();
  lVar3 = uVar2 - embree::progressDots;
  embree::progressDots = uVar2;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    std::operator<<((ostream *)&std::cout,".");
    std::ostream::flush();
  }
  return true;
}

Assistant:

bool progressMonitor(void* ptr, const double n)
  {
    size_t olddots = progressDots;
    size_t maxdots = progressWidth-2;
    size_t newdots = max(olddots,min(size_t(maxdots),size_t(n*double(maxdots))));
    if (progressDots.compare_exchange_strong(olddots,newdots))
      for (size_t i=olddots; i<newdots; i++) std::cout << "." << std::flush;
    return true;
  }